

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

node_t unary_expression(void)

{
  int iVar1;
  node_t pvVar2;
  char *pcVar3;
  node_t right;
  int op;
  node_t n;
  node_t in_stack_ffffffffffffffd8;
  node_t local_8;
  
  local_8 = postfix_expression();
  if (local_8 == (node_t)0x0) {
    iVar1 = unary_operator();
    if (iVar1 == 0) {
      local_8 = (node_t)0x0;
    }
    else {
      iVar1 = t->id;
      next();
      pvVar2 = cast_expression();
      if (pvVar2 == (node_t)0x0) {
        pcVar3 = token_name(iVar1);
        err(E,"expected expression after %s",pcVar3);
        local_8 = (node_t)0x0;
      }
      else {
        local_8 = unop((int)((ulong)pvVar2 >> 0x20),in_stack_ffffffffffffffd8);
      }
    }
  }
  return local_8;
}

Assistant:

node_t unary_expression()
{
    node_t n = NULL;
    if ((n = postfix_expression()))
    {
        return n;
    }
    else if (unary_operator())
    {
        int op = t->id;
        node_t right = NULL;
        next();
        if (!(right = cast_expression()))
        {
            err(E, "expected expression after %s", token_name(op));
            return NULL;
        }

        n = unop(op, right);

        return n;
    }

    return NULL;
}